

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O3

void Fl_Tooltip::exit_(Fl_Widget *w)

{
  if ((widget_ != (Fl_Widget *)0x0) && ((w == (Fl_Widget *)0x0 || ((Fl_Widget *)window != w)))) {
    widget_ = (Fl_Widget *)0x0;
    Fl::remove_timeout(tooltip_timeout,(void *)0x0);
    Fl::remove_timeout(recent_timeout,(void *)0x0);
    if ((window != (Fl_TooltipBox *)0x0) &&
       (((window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
         super_Fl_Widget.flags_ & 2) == 0)) {
      (*(window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
        super_Fl_Widget._vptr_Fl_Widget[6])();
    }
    if (recent_tooltip == '\x01') {
      if ((Fl::e_state._3_1_ & 0x7f) == 0) {
        Fl::add_timeout((double)hoverdelay_,recent_timeout,(void *)0x0);
        return;
      }
      recent_tooltip = '\0';
    }
  }
  return;
}

Assistant:

void Fl_Tooltip::exit_(Fl_Widget *w) {
#ifdef DEBUG
  printf("Fl_Tooltip::exit_(w=%p)\n", w);
  printf("    widget=%p, window=%p\n", widget_, window);
#endif // DEBUG

  if (!widget_ || (w && w == window)) return;
  widget_ = 0;
  Fl::remove_timeout(tooltip_timeout);
  Fl::remove_timeout(recent_timeout);
  if (window && window->visible()) window->hide();
  if (recent_tooltip) {
    if (Fl::event_state() & FL_BUTTONS) recent_tooltip = 0;
    else Fl::add_timeout(Fl_Tooltip::hoverdelay(), recent_timeout);
  }
}